

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O0

uint32_t __thiscall
PolygonTriangulation::search_trapezoid_index(PolygonTriangulation *this,vertex_t *v,QNode_t *node)

{
  QNodeType_t QVar1;
  bool bVar2;
  reference segment;
  double dVar3;
  uint32_t local_48;
  uint32_t local_44;
  QNode_t *node_local;
  vertex_t *v_local;
  PolygonTriangulation *this_local;
  
  if (node != (QNode_t *)0x0) {
    QVar1 = node->type;
    if (QVar1 == X_NODE) {
      segment = std::vector<segment_t,_std::allocator<segment_t>_>::operator[]
                          (&this->segments_,(ulong)node->key_index);
      dVar3 = distance_from_segment(this,v,segment);
      if (0.0 < dVar3) {
        local_44 = search_trapezoid_index(this,v,node->right);
      }
      else {
        local_44 = search_trapezoid_index(this,v,node->left);
      }
      this_local._4_4_ = local_44;
    }
    else if (QVar1 == Y_NODE) {
      bVar2 = anon_unknown.dwarf_176b9::is_vertex_lower(v,this->vertices_ + node->key_index);
      if (bVar2) {
        local_48 = search_trapezoid_index(this,v,node->left);
      }
      else {
        local_48 = search_trapezoid_index(this,v,node->right);
      }
      this_local._4_4_ = local_48;
    }
    else if (QVar1 == SINK) {
      this_local._4_4_ = node->key_index;
    }
    else {
      this_local._4_4_ = 0xffffffff;
    }
    return this_local._4_4_;
  }
  __assert_fail("nullptr != node",
                "/workspace/llm4binary/github/license_c_cmakelists/tcoppex[P]polytri/src/trapezoidal_decomposition.cc"
                ,0x70,
                "uint32_t PolygonTriangulation::search_trapezoid_index(const vertex_t &, const QNode_t *)"
               );
}

Assistant:

uint32_t PolygonTriangulation::search_trapezoid_index(const vertex_t &v, const QNode_t *node)
{
  assert(nullptr != node);
  switch (node->type) {
    case X_NODE: {
      return (distance_from_segment(v, segments_[node->key_index]) <= 0.0) ?
            search_trapezoid_index(v, node->left)  :
            search_trapezoid_index(v, node->right) ;
    }

    case Y_NODE: {
      return is_vertex_lower(v, vertices_[node->key_index]) ?
            search_trapezoid_index(v, node->left)  :
            search_trapezoid_index(v, node->right) ;
    }

    case SINK: {
      return node->key_index;
    }
  }

  return kInvalidIndex;
}